

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

void __thiscall
QToolBarAreaLayoutInfo::insertItem(QToolBarAreaLayoutInfo *this,QToolBar *before,QLayoutItem *item)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  reference pQVar4;
  const_reference pQVar5;
  undefined4 extraout_var;
  QList<QToolBarAreaLayoutItem> *this_00;
  QLayoutItem *in_RDX;
  long in_RSI;
  QList<QToolBarAreaLayoutLine> *in_RDI;
  long in_FS_OFFSET;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  undefined4 in_stack_ffffffffffffff28;
  Orientation in_stack_ffffffffffffff2c;
  QToolBarAreaLayoutLine *in_stack_ffffffffffffff30;
  QList<QToolBarAreaLayoutItem> *i;
  int local_94;
  int local_84;
  QToolBarAreaLayoutItem local_38;
  QToolBarAreaLayoutItem local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    bVar1 = QList<QToolBarAreaLayoutLine>::isEmpty((QList<QToolBarAreaLayoutLine> *)0x6f0ee7);
    if (bVar1) {
      QToolBarAreaLayoutLine::QToolBarAreaLayoutLine
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      QList<QToolBarAreaLayoutLine>::append
                ((QList<QToolBarAreaLayoutLine> *)in_stack_ffffffffffffff30,
                 (rvalue_ref)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      QToolBarAreaLayoutLine::~QToolBarAreaLayoutLine((QToolBarAreaLayoutLine *)0x6f0f18);
    }
    QList<QToolBarAreaLayoutLine>::last
              ((QList<QToolBarAreaLayoutLine> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QToolBarAreaLayoutItem::QToolBarAreaLayoutItem(&local_20,in_RDX);
    QList<QToolBarAreaLayoutItem>::append
              ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff30,
               (rvalue_ref)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  else {
    for (local_84 = 0; qVar3 = QList<QToolBarAreaLayoutLine>::size(in_RDI), local_84 < qVar3;
        local_84 = local_84 + 1) {
      pQVar4 = QList<QToolBarAreaLayoutLine>::operator[]
                         ((QList<QToolBarAreaLayoutLine> *)in_stack_ffffffffffffff30,
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      for (local_94 = 0; qVar3 = QList<QToolBarAreaLayoutItem>::size(&pQVar4->toolBarItems),
          local_94 < qVar3; local_94 = local_94 + 1) {
        pQVar5 = QList<QToolBarAreaLayoutItem>::at
                           ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff30,
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        iVar2 = (*pQVar5->widgetItem->_vptr_QLayoutItem[0xd])();
        if (CONCAT44(extraout_var,iVar2) == in_RSI) {
          i = &pQVar4->toolBarItems;
          this_00 = (QList<QToolBarAreaLayoutItem> *)(long)local_94;
          QToolBarAreaLayoutItem::QToolBarAreaLayoutItem(&local_38,in_RDX);
          QList<QToolBarAreaLayoutItem>::insert
                    (this_00,(qsizetype)i,
                     (rvalue_ref)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          goto LAB_006f1060;
        }
      }
    }
  }
LAB_006f1060:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarAreaLayoutInfo::insertItem(QToolBar *before, QLayoutItem *item)
{
    if (before == nullptr) {
        if (lines.isEmpty())
            lines.append(QToolBarAreaLayoutLine(o));
        lines.last().toolBarItems.append(item);
        return;
    }

    for (int j = 0; j < lines.size(); ++j) {
        QToolBarAreaLayoutLine &line = lines[j];

        for (int k = 0; k < line.toolBarItems.size(); ++k) {
            if (line.toolBarItems.at(k).widgetItem->widget() == before) {
                line.toolBarItems.insert(k, item);
                return;
            }
        }
    }
}